

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.h
# Opt level: O0

ostream * ser::operator<<(ostream *out,Savepoint *sp)

{
  ostream *poVar1;
  string local_38;
  Savepoint *local_18;
  Savepoint *sp_local;
  ostream *out_local;
  
  local_18 = sp;
  sp_local = (Savepoint *)out;
  Savepoint::ToString_abi_cxx11_(&local_38,sp);
  poVar1 = std::operator<<(out,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, const Savepoint& sp)
    {
        return out << sp.ToString();
    }